

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractnetworkcache.cpp
# Opt level: O1

void __thiscall QNetworkCacheMetaData::setUrl(QNetworkCacheMetaData *this,QUrl *url)

{
  QNetworkCacheMetaDataPrivate *pQVar1;
  QUrl *this_00;
  long in_FS_OFFSET;
  QArrayData *local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 != (QNetworkCacheMetaDataPrivate *)0x0) &&
     ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1)) {
    QSharedDataPointer<QNetworkCacheMetaDataPrivate>::detach_helper(&this->d);
  }
  this_00 = &((this->d).d.ptr)->url;
  QUrl::operator=(this_00,url);
  local_38 = (QArrayData *)0x0;
  uStack_30 = 0;
  local_28 = 0;
  QUrl::setPassword((QString *)this_00,(ParsingMode)&local_38);
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,0x10);
    }
  }
  local_38 = (QArrayData *)0x0;
  uStack_30 = 0;
  local_28 = 0;
  QUrl::setFragment((QString *)this_00,(ParsingMode)&local_38);
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkCacheMetaData::setUrl(const QUrl &url)
{
    auto *p = d.data();
    p->url = url;
    p->url.setPassword(QString());
    p->url.setFragment(QString());
}